

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase133::run(TestCase133 *this)

{
  bool bVar1;
  int local_1c8;
  bool local_1c1;
  int local_1c0;
  DebugExpression<int> DStack_1bc;
  bool _kj_shouldLog_4;
  undefined1 local_1b8 [8];
  DebugComparison<int,_int_&> _kjCondition_4;
  int local_188;
  DebugExpression<int> DStack_184;
  bool _kj_shouldLog_3;
  undefined1 local_180 [8];
  DebugComparison<int,_int_&> _kjCondition_3;
  TestObject *local_150;
  bool local_141;
  TestObject *pTStack_140;
  bool _kj_shouldLog_2;
  TestObject *local_138;
  TestObject *local_130;
  undefined1 local_128 [8];
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  _kjCondition_2;
  uint local_f8;
  bool local_f1;
  size_t sStack_f0;
  bool _kj_shouldLog_1;
  uint local_e8;
  DebugExpression<unsigned_int> local_e4;
  undefined1 local_e0 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_1;
  uint local_b0;
  bool local_a9;
  size_t sStack_a8;
  bool _kj_shouldLog;
  uint local_a0;
  DebugExpression<unsigned_int> local_9c;
  undefined1 local_98 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Array<kj::(anonymous_namespace)::TestObject> arr2;
  undefined1 local_48 [8];
  Array<kj::(anonymous_namespace)::TestObject> arr1;
  Arena arena;
  TestCase133 *this_local;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena((Arena *)&arr1.disposer,0x400);
  Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>
            ((Array<kj::(anonymous_namespace)::TestObject> *)local_48,(Arena *)&arr1.disposer,4);
  Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>
            ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result,
             (Arena *)&arr1.disposer,2);
  local_a0 = 4;
  local_9c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a0);
  sStack_a8 = Array<kj::(anonymous_namespace)::TestObject>::size
                        ((Array<kj::(anonymous_namespace)::TestObject> *)local_48);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_98,&local_9c,
             &stack0xffffffffffffff58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar1) {
    local_a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_a9 != false) {
      local_b0 = 4;
      _kjCondition_1._32_8_ =
           Array<kj::(anonymous_namespace)::TestObject>::size
                     ((Array<kj::(anonymous_namespace)::TestObject> *)local_48);
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x8e,ERROR,
                 "\"failed: expected \" \"(4u) == (arr1.size())\", _kjCondition, 4u, arr1.size()",
                 (char (*) [39])"failed: expected (4u) == (arr1.size())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_98,&local_b0,
                 (unsigned_long *)&_kjCondition_1.result);
      local_a9 = false;
    }
  }
  local_e8 = 2;
  local_e4 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e8);
  sStack_f0 = Array<kj::(anonymous_namespace)::TestObject>::size
                        ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_e0,&local_e4,
             &stack0xffffffffffffff10);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
  if (!bVar1) {
    local_f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_f1 != false) {
      local_f8 = 2;
      _kjCondition_2._32_8_ =
           Array<kj::(anonymous_namespace)::TestObject>::size
                     ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result);
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x8f,ERROR,
                 "\"failed: expected \" \"(2u) == (arr2.size())\", _kjCondition, 2u, arr2.size()",
                 (char (*) [39])"failed: expected (2u) == (arr2.size())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_e0,&local_f8,
                 (unsigned_long *)&_kjCondition_2.result);
      local_f1 = false;
    }
  }
  local_138 = Array<kj::(anonymous_namespace)::TestObject>::end
                        ((Array<kj::(anonymous_namespace)::TestObject> *)local_48);
  local_130 = (TestObject *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_138);
  pTStack_140 = Array<kj::(anonymous_namespace)::TestObject>::begin
                          ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result);
  kj::_::DebugExpression<kj::(anonymous_namespace)::TestObject*>::operator<=
            ((DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
              *)local_128,(DebugExpression<kj::(anonymous_namespace)::TestObject*> *)&local_130,
             &stack0xfffffffffffffec0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
  if (!bVar1) {
    local_141 = kj::_::Debug::shouldLog(ERROR);
    while (local_141 != false) {
      local_150 = Array<kj::(anonymous_namespace)::TestObject>::end
                            ((Array<kj::(anonymous_namespace)::TestObject> *)local_48);
      _kjCondition_3._32_8_ =
           Array<kj::(anonymous_namespace)::TestObject>::begin
                     ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result);
      kj::_::Debug::
      log<char_const(&)[48],kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&,kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"(arr1.end()) <= (arr2.begin())\", _kjCondition, arr1.end(), arr2.begin()"
                 ,(char (*) [48])"failed: expected (arr1.end()) <= (arr2.begin())",
                 (DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
                  *)local_128,&local_150,(TestObject **)&_kjCondition_3.result);
      local_141 = false;
    }
  }
  local_188 = 6;
  DStack_184 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_188);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_180,&stack0xfffffffffffffe7c,
             &(anonymous_namespace)::TestObject::count);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      _kjCondition_4.result = true;
      _kjCondition_4._33_3_ = 0;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"(6) == (TestObject::count)\", _kjCondition, 6, TestObject::count"
                 ,(char (*) [44])"failed: expected (6) == (TestObject::count)",
                 (DebugComparison<int,_int_&> *)local_180,(int *)&_kjCondition_4.result,
                 &(anonymous_namespace)::TestObject::count);
      _kjCondition_4._39_1_ = 0;
    }
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array
            ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result);
  Array<kj::(anonymous_namespace)::TestObject>::~Array
            ((Array<kj::(anonymous_namespace)::TestObject> *)local_48);
  local_1c0 = 0;
  DStack_1bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_1b8,&stack0xfffffffffffffe44,
             &(anonymous_namespace)::TestObject::count);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b8);
  if (!bVar1) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      local_1c8 = 0;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
                 ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
                 (DebugComparison<int,_int_&> *)local_1b8,&local_1c8,
                 &(anonymous_namespace)::TestObject::count);
      local_1c1 = false;
    }
  }
  Arena::~Arena((Arena *)&arr1.disposer);
  return;
}

Assistant:

TEST(Arena, OwnArray) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Arena arena;

  {
    Array<TestObject> arr1 = arena.allocateOwnArray<TestObject>(4);
    Array<TestObject> arr2 = arena.allocateOwnArray<TestObject>(2);
    EXPECT_EQ(4u, arr1.size());
    EXPECT_EQ(2u, arr2.size());
    EXPECT_LE(arr1.end(), arr2.begin());
    EXPECT_EQ(6, TestObject::count);
  }

  EXPECT_EQ(0, TestObject::count);
}